

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomrand48.cpp
# Opt level: O0

uint32_t __thiscall jrtplib::RTPRandomRand48::GetRandom32(RTPRandomRand48 *this)

{
  uint32_t x;
  RTPRandomRand48 *this_local;
  
  this->state = this->state * 0x5deece66d + 0xb & 0xffffffffffff;
  return (uint32_t)(this->state >> 0x10);
}

Assistant:

uint32_t RTPRandomRand48::GetRandom32()
{
#ifdef RTP_SUPPORT_THREAD
	mutex.Lock();
#endif // RTP_SUPPORT_THREAD

#ifdef RTP_HAVE_VSUINT64SUFFIX
	state = ((0x5DEECE66Dui64*state) + 0xBui64)&0x0000ffffffffffffui64;

	uint32_t x = (uint32_t)((state>>16)&0xffffffffui64);
#else
	state = ((0x5DEECE66DULL*state) + 0xBULL)&0x0000ffffffffffffULL;

	uint32_t x = (uint32_t)((state>>16)&0xffffffffULL);
#endif // RTP_HAVE_VSUINT64SUFFIX

#ifdef RTP_SUPPORT_THREAD
	mutex.Unlock();
#endif // RTP_SUPPORT_THREAD
	return x;
}